

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.cpp
# Opt level: O0

Class * __thiscall cppgenerate::Class::operator=(Class *this,Class *other)

{
  Class *other_local;
  Class *this_local;
  
  if (this != other) {
    std::__cxx11::string::operator=((string *)this,(string *)other);
    std::__cxx11::string::operator=((string *)&this->m_namespace,(string *)&other->m_namespace);
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(&this->m_systemIncludes);
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(&this->m_systemIncludes,&other->m_systemIncludes);
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(&this->m_localIncludes);
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(&this->m_localIncludes,&other->m_localIncludes);
    std::vector<cppgenerate::Method,_std::allocator<cppgenerate::Method>_>::clear(&this->m_methods);
    std::vector<cppgenerate::Method,_std::allocator<cppgenerate::Method>_>::operator=
              (&this->m_methods,&other->m_methods);
    std::vector<cppgenerate::MemberVariable,_std::allocator<cppgenerate::MemberVariable>_>::clear
              (&this->m_memberVariables);
    std::__cxx11::string::operator=
              ((string *)&this->m_documentation,(string *)&other->m_documentation);
    this->m_isQobject = (bool)(other->m_isQobject & 1);
    std::vector<cppgenerate::Constructor,_std::allocator<cppgenerate::Constructor>_>::clear
              (&this->m_constructors);
    std::vector<cppgenerate::Constructor,_std::allocator<cppgenerate::Constructor>_>::operator=
              (&this->m_constructors,&other->m_constructors);
    std::vector<cppgenerate::Class::Parent,_std::allocator<cppgenerate::Class::Parent>_>::clear
              (&this->m_parents);
    std::vector<cppgenerate::Class::Parent,_std::allocator<cppgenerate::Class::Parent>_>::operator=
              (&this->m_parents,&other->m_parents);
  }
  return this;
}

Assistant:

Class& Class::operator=( const Class& other ){
    if( this != &other ){
        m_className = other.m_className;
        m_namespace = other.m_namespace;
        m_systemIncludes.clear();
        m_systemIncludes = other.m_systemIncludes;
        m_localIncludes.clear();
        m_localIncludes = other.m_localIncludes;
        m_methods.clear();
        m_methods = other.m_methods;
        m_memberVariables.clear();
        m_documentation = other.m_documentation;
        m_isQobject = other.m_isQobject;
        m_constructors.clear();
        m_constructors = other.m_constructors;
        m_parents.clear();
        m_parents = other.m_parents;
    }

    return *this;
}